

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall BotscriptParser::parseBreak(BotscriptParser *this)

{
  ScopeType SVar1;
  _Map_pointer ppSVar2;
  undefined8 in_RAX;
  _Elt_pointer pSVar3;
  _Elt_pointer pSVar4;
  _Elt_pointer pSVar5;
  int iVar6;
  difference_type __node_offset;
  long lVar7;
  ByteMark *mark;
  DataBuffer *pDVar8;
  int local_28;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (this->m_scopeCursor == 0) {
    error<>("unexpected `break`");
  }
  pDVar8 = this->m_switchBuffer;
  if (pDVar8 == (DataBuffer *)0x0) {
    if (this->m_currentMode == Onenter) {
      pDVar8 = this->m_onenterBuffer;
    }
    else if (this->m_currentMode == MainLoop) {
      pDVar8 = this->m_mainLoopBuffer;
    }
    else {
      pDVar8 = this->m_mainBuffer;
    }
  }
  DataBuffer::writeHeader(pDVar8,Goto);
  local_28 = this->m_scopeCursor;
  ppSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  iVar6 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_start._M_last - (long)pSVar3) >> 3) *
          0x677d46cf +
          (int)((ulong)((long)(this->m_scopeStack)._deque.
                              super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                              super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
          (int)((ulong)((long)ppSVar2 -
                       (long)(this->m_scopeStack)._deque.
                             super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                             super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar2 == (_Map_pointer)0x0);
  if (iVar6 <= local_28) {
    local_24 = iVar6;
    error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                   ,&local_28,&local_24);
    pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  pSVar4 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_first;
  lVar7 = ((long)pSVar3 - (long)pSVar4 >> 3) * 0x51b3bea3677d46cf + (long)local_28;
  if (lVar7 == 0) {
    pSVar5 = pSVar3 + local_28;
  }
  else {
    pSVar5 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node[lVar7];
  }
  SVar1 = pSVar5->type;
  if (SVar1 - 2 < 2) {
    pDVar8 = this->m_switchBuffer;
    if (pDVar8 == (DataBuffer *)0x0) {
      if (this->m_currentMode == Onenter) {
        pDVar8 = this->m_onenterBuffer;
      }
      else if (this->m_currentMode == MainLoop) {
        pDVar8 = this->m_mainLoopBuffer;
      }
      else {
        pDVar8 = this->m_mainBuffer;
      }
    }
    local_28 = this->m_scopeCursor;
    ppSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar6 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_start._M_last - (long)pSVar3) >> 3) *
            0x677d46cf +
            (int)((ulong)((long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
            (int)((ulong)((long)ppSVar2 -
                         (long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppSVar2 == (_Map_pointer)0x0);
    if (iVar6 <= local_28) {
      local_24 = iVar6;
      error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                     ,&local_28,&local_24);
      pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      pSVar4 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_first;
    }
    lVar7 = ((long)pSVar3 - (long)pSVar4 >> 3) * 0x51b3bea3677d46cf + (long)local_28;
    if (lVar7 == 0) {
      pSVar3 = pSVar3 + local_28;
    }
    else {
      pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node[lVar7];
    }
    mark = pSVar3->mark2;
  }
  else {
    if ((SVar1 != SCOPE_Switch) && (SVar1 != SCOPE_If)) {
      error<>("unexpected `break`");
      goto LAB_0012862c;
    }
    pDVar8 = this->m_switchBuffer;
    if (pDVar8 == (DataBuffer *)0x0) {
      if (this->m_currentMode == Onenter) {
        pDVar8 = this->m_onenterBuffer;
      }
      else if (this->m_currentMode == MainLoop) {
        pDVar8 = this->m_mainLoopBuffer;
      }
      else {
        pDVar8 = this->m_mainBuffer;
      }
    }
    local_28 = this->m_scopeCursor;
    ppSVar2 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    iVar6 = (int)((ulong)((long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_start._M_last - (long)pSVar3) >> 3) *
            0x677d46cf +
            (int)((ulong)((long)(this->m_scopeStack)._deque.
                                super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                                super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_finish._M_first) >> 3) * 0x677d46cf +
            (int)((ulong)((long)ppSVar2 -
                         (long)(this->m_scopeStack)._deque.
                               super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>._M_impl.
                               super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppSVar2 == (_Map_pointer)0x0);
    if (iVar6 <= local_28) {
      local_24 = iVar6;
      error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                     ,&local_28,&local_24);
      pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      pSVar4 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_first;
    }
    lVar7 = ((long)pSVar3 - (long)pSVar4 >> 3) * 0x51b3bea3677d46cf + (long)local_28;
    if (lVar7 == 0) {
      pSVar3 = pSVar3 + local_28;
    }
    else {
      pSVar3 = (this->m_scopeStack)._deque.super__Deque_base<ScopeInfo,_std::allocator<ScopeInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node[lVar7];
    }
    mark = pSVar3->mark1;
  }
  DataBuffer::addReference(pDVar8,mark);
LAB_0012862c:
  Lexer::mustGetNext(this->m_lexer,Semicolon);
  return;
}

Assistant:

void BotscriptParser::parseBreak()
{
	if (m_scopeCursor == 0)
		error ("unexpected `break`");

	currentBuffer()->writeHeader (DataHeader::Goto);

	// switch and if use mark1 for the closing point,
	// for and while use mark2.
	switch (SCOPE (0).type)
	{
		case SCOPE_If:
		case SCOPE_Switch:
			currentBuffer()->addReference (SCOPE (0).mark1);
			break;

		case SCOPE_For:
		case SCOPE_While:
			currentBuffer()->addReference (SCOPE (0).mark2);
			break;

		default:
			error ("unexpected `break`");
			break;
	}

	m_lexer->mustGetNext (Token::Semicolon);
}